

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::AnonymousProgramSyntax::AnonymousProgramSyntax
          (AnonymousProgramSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endkeyword)

{
  bool bVar1;
  reference ppMVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  MemberSyntax *in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_RSI,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             in_stack_ffffffffffffffc0._M_current);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff98);
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[5].parent = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff98);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    ((*ppMVar2)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

AnonymousProgramSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token semi, const SyntaxList<MemberSyntax>& members, Token endkeyword) :
        MemberSyntax(SyntaxKind::AnonymousProgram, attributes), keyword(keyword), semi(semi), members(members), endkeyword(endkeyword) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }